

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.c
# Opt level: O1

int mustache_buffer_insert(MUSTACHE_BUFFER *buf,off_t off,void *data,size_t n)

{
  uint8_t *puVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = buf->n + n;
  if (buf->alloc < uVar3) {
    sVar2 = uVar3 * 2;
    puVar1 = (uint8_t *)realloc(buf->data,sVar2);
    if (puVar1 == (uint8_t *)0x0) {
      return -1;
    }
    buf->data = puVar1;
    buf->alloc = sVar2;
  }
  sVar2 = buf->n - off;
  if ((ulong)off <= buf->n && sVar2 != 0) {
    memmove(buf->data + off + n,buf->data + off,sVar2);
  }
  memcpy(buf->data + off,data,n);
  buf->n = buf->n + n;
  return 0;
}

Assistant:

static int
mustache_buffer_insert(MUSTACHE_BUFFER* buf, off_t off, const void* data, size_t n)
{
    if(buf->n + n > buf->alloc) {
        size_t new_alloc = (buf->n + n) * 2;
        uint8_t* new_data;

        new_data = (uint8_t*) realloc(buf->data, new_alloc);
        if(new_data == NULL)
            return -1;

        buf->data = new_data;
        buf->alloc = new_alloc;
    }

    if(off < buf->n)
        memmove(buf->data + off + n, buf->data + off, buf->n - off);

    memcpy(buf->data + off, data, n);
    buf->n += n;
    return 0;
}